

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
__thiscall
anon_unknown.dwarf_1bf255::BuildSystemImpl::createNode
          (BuildSystemImpl *this,StringRef name,bool isImplicit)

{
  BuildNode *this_00;
  NodeType type;
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = name.Length;
  pcVar2 = name.Data;
  if (sVar1 != 0) {
    if (pcVar2[sVar1 - 1] == '/') {
      this_00 = (BuildNode *)operator_new(0x70);
      type = Directory;
      goto LAB_001682dc;
    }
    if ((*pcVar2 == '<') && (pcVar2[sVar1 - 1] == '>')) {
      this_00 = (BuildNode *)operator_new(0x70);
      type = Virtual;
      goto LAB_001682dc;
    }
  }
  this_00 = (BuildNode *)operator_new(0x70);
  type = Plain;
LAB_001682dc:
  llbuild::buildsystem::BuildNode::BuildNode(this_00,name,type);
  this->buildSystem = (BuildSystem *)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BuildNode>
BuildSystemImpl::createNode(StringRef name, bool isImplicit) {
  if (name.endswith("/")) {
    return BuildNode::makeDirectory(name);
  }

  if (!name.empty() && name[0] == '<' && name.back() == '>') {
    return BuildNode::makeVirtual(name);
  }

  return BuildNode::makePlain(name);
}